

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::GcCompactTransientWindowBuffers(ImGuiWindow *window)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x3e0) = 1;
  *(undefined4 *)(in_RDI + 0x3d8) = *(undefined4 *)(*(long *)(in_RDI + 0x2b8) + 0x14);
  *(undefined4 *)(in_RDI + 0x3dc) = *(undefined4 *)(*(long *)(in_RDI + 0x2b8) + 0x24);
  ImVector<unsigned_int>::clear((ImVector<unsigned_int> *)window);
  ImDrawList::_ClearFreeMemory((ImDrawList *)window);
  ImVector<ImGuiWindow_*>::clear((ImVector<ImGuiWindow_*> *)window);
  ImVector<float>::clear((ImVector<float> *)window);
  ImVector<float>::clear((ImVector<float> *)window);
  return;
}

Assistant:

void ImGui::GcCompactTransientWindowBuffers(ImGuiWindow* window)
{
    window->MemoryCompacted = true;
    window->MemoryDrawListIdxCapacity = window->DrawList->IdxBuffer.Capacity;
    window->MemoryDrawListVtxCapacity = window->DrawList->VtxBuffer.Capacity;
    window->IDStack.clear();
    window->DrawList->_ClearFreeMemory();
    window->DC.ChildWindows.clear();
    window->DC.ItemWidthStack.clear();
    window->DC.TextWrapPosStack.clear();
}